

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O2

string * __thiscall muduo::Date::toIsoString_abi_cxx11_(string *__return_storage_ptr__,Date *this)

{
  YearMonthDay YVar1;
  allocator local_39;
  char buf [32];
  
  YVar1 = yearMonthDay(this);
  snprintf(buf,0x20,"%4d-%02d-%02d",(ulong)(uint)YVar1.year,YVar1._0_8_ >> 0x20,
           (ulong)(uint)YVar1.day);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buf,&local_39);
  return __return_storage_ptr__;
}

Assistant:

string Date::toIsoString() const
{
  char buf[32];
  YearMonthDay ymd(yearMonthDay());
  snprintf(buf, sizeof buf, "%4d-%02d-%02d", ymd.year, ymd.month, ymd.day);
  return buf;
}